

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniform_int_distribution.h
# Opt level: O0

unsigned_type __thiscall
absl::lts_20250127::uniform_int_distribution<int>::
Generate<absl::lts_20250127::random_internal::NonsecureURBGBase<absl::lts_20250127::random_internal::randen_engine<unsigned_long>,absl::lts_20250127::random_internal::RandenPoolSeedSeq>>
          (uniform_int_distribution<int> *this,
          NonsecureURBGBase<absl::lts_20250127::random_internal::randen_engine<unsigned_long>,_absl::lts_20250127::random_internal::RandenPoolSeedSeq>
          *g,unsigned_type R)

{
  result_type_conflict1 rVar1;
  uint b;
  input_type iVar2;
  uint uVar3;
  result_type rStack_38;
  unsigned_type threshold;
  result_type product;
  unsigned_type Lim;
  unsigned_type bits;
  FastUniformBits<unsigned_int> fast_bits;
  NonsecureURBGBase<absl::lts_20250127::random_internal::randen_engine<unsigned_long>,_absl::lts_20250127::random_internal::RandenPoolSeedSeq>
  *pNStack_20;
  unsigned_type R_local;
  NonsecureURBGBase<absl::lts_20250127::random_internal::randen_engine<unsigned_long>,_absl::lts_20250127::random_internal::RandenPoolSeedSeq>
  *g_local;
  uniform_int_distribution<int> *this_local;
  
  bits = R;
  pNStack_20 = g;
  rVar1 = random_internal::FastUniformBits<unsigned_int>::operator()
                    ((FastUniformBits<unsigned_int> *)((long)&Lim + 3),g);
  b = bits + 1;
  if ((bits & b) == 0) {
    this_local._4_4_ = rVar1 & bits;
  }
  else {
    rStack_38 = random_internal::wide_multiply<unsigned_int>::multiply(rVar1,b);
    iVar2 = random_internal::wide_multiply<unsigned_int>::lo(rStack_38);
    if (iVar2 < b) {
      uVar3 = std::numeric_limits<unsigned_int>::max();
      while (iVar2 = random_internal::wide_multiply<unsigned_int>::lo(rStack_38),
            iVar2 < ((uVar3 - b) + 1) % b) {
        rVar1 = random_internal::FastUniformBits<unsigned_int>::operator()
                          ((FastUniformBits<unsigned_int> *)((long)&Lim + 3),pNStack_20);
        rStack_38 = random_internal::wide_multiply<unsigned_int>::multiply(rVar1,b);
      }
    }
    this_local._4_4_ = random_internal::wide_multiply<unsigned_int>::hi(rStack_38);
  }
  return this_local._4_4_;
}

Assistant:

typename random_internal::make_unsigned_bits<IntType>::type
uniform_int_distribution<IntType>::Generate(
    URBG& g,  // NOLINT(runtime/references)
    typename random_internal::make_unsigned_bits<IntType>::type R) {
  random_internal::FastUniformBits<unsigned_type> fast_bits;
  unsigned_type bits = fast_bits(g);
  const unsigned_type Lim = R + 1;
  if ((R & Lim) == 0) {
    // If the interval's length is a power of two range, just take the low bits.
    return bits & R;
  }

  // Generates a uniform variate on [0, Lim) using fixed-point multiplication.
  // The above fast-path guarantees that Lim is representable in unsigned_type.
  //
  // Algorithm adapted from
  // http://lemire.me/blog/2016/06/30/fast-random-shuffling/, with added
  // explanation.
  //
  // The algorithm creates a uniform variate `bits` in the interval [0, 2^N),
  // and treats it as the fractional part of a fixed-point real value in [0, 1),
  // multiplied by 2^N.  For example, 0.25 would be represented as 2^(N - 2),
  // because 2^N * 0.25 == 2^(N - 2).
  //
  // Next, `bits` and `Lim` are multiplied with a wide-multiply to bring the
  // value into the range [0, Lim).  The integral part (the high word of the
  // multiplication result) is then very nearly the desired result.  However,
  // this is not quite accurate; viewing the multiplication result as one
  // double-width integer, the resulting values for the sample are mapped as
  // follows:
  //
  // If the result lies in this interval:       Return this value:
  //        [0, 2^N)                                    0
  //        [2^N, 2 * 2^N)                              1
  //        ...                                         ...
  //        [K * 2^N, (K + 1) * 2^N)                    K
  //        ...                                         ...
  //        [(Lim - 1) * 2^N, Lim * 2^N)                Lim - 1
  //
  // While all of these intervals have the same size, the result of `bits * Lim`
  // must be a multiple of `Lim`, and not all of these intervals contain the
  // same number of multiples of `Lim`.  In particular, some contain
  // `F = floor(2^N / Lim)` and some contain `F + 1 = ceil(2^N / Lim)`.  This
  // difference produces a small nonuniformity, which is corrected by applying
  // rejection sampling to one of the values in the "larger intervals" (i.e.,
  // the intervals containing `F + 1` multiples of `Lim`.
  //
  // An interval contains `F + 1` multiples of `Lim` if and only if its smallest
  // value modulo 2^N is less than `2^N % Lim`.  The unique value satisfying
  // this property is used as the one for rejection.  That is, a value of
  // `bits * Lim` is rejected if `(bit * Lim) % 2^N < (2^N % Lim)`.

  using helper = random_internal::wide_multiply<unsigned_type>;
  auto product = helper::multiply(bits, Lim);

  // Two optimizations here:
  // * Rejection occurs with some probability less than 1/2, and for reasonable
  //   ranges considerably less (in particular, less than 1/(F+1)), so
  //   ABSL_PREDICT_FALSE is apt.
  // * `Lim` is an overestimate of `threshold`, and doesn't require a divide.
  if (ABSL_PREDICT_FALSE(helper::lo(product) < Lim)) {
    // This quantity is exactly equal to `2^N % Lim`, but does not require high
    // precision calculations: `2^N % Lim` is congruent to `(2^N - Lim) % Lim`.
    // Ideally this could be expressed simply as `-X` rather than `2^N - X`, but
    // for types smaller than int, this calculation is incorrect due to integer
    // promotion rules.
    const unsigned_type threshold =
        ((std::numeric_limits<unsigned_type>::max)() - Lim + 1) % Lim;
    while (helper::lo(product) < threshold) {
      bits = fast_bits(g);
      product = helper::multiply(bits, Lim);
    }
  }

  return helper::hi(product);
}